

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O3

Type __thiscall
wabt::anon_unknown_4::Validator::GetDeclarationType(Validator *this,FuncDeclaration *decl)

{
  pointer pTVar1;
  pointer pTVar2;
  Type TVar3;
  ulong uVar4;
  
  if (decl->has_func_type == true) {
    if ((decl->type_var).type_ != Index) {
      __assert_fail("is_index()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/ir.h"
                    ,0x3a,"Index wabt::Var::index() const");
    }
    uVar4 = 0xffffffff00000000;
    TVar3.type_index_ = 0;
    TVar3.enum_ = (decl->type_var).field_2.index_;
    goto LAB_001374fc;
  }
  uVar4 = 0xffffffff00000000;
  if ((decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pTVar1 = (decl->sig).result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pTVar2 = (decl->sig).result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pTVar1 == pTVar2) {
      TVar3.enum_ = Void;
      TVar3.type_index_ = 0;
      goto LAB_001374fc;
    }
    if ((long)pTVar2 - (long)pTVar1 == 8) {
      TVar3 = *pTVar1;
      uVar4 = (ulong)TVar3 & 0xffffffff00000000;
      goto LAB_001374fc;
    }
  }
  TVar3.enum_ = Module::GetFuncTypeIndex((Module *)this,decl);
  TVar3.type_index_ = 0;
LAB_001374fc:
  return (Type)((ulong)TVar3 & 0xffffffff | uVar4);
}

Assistant:

Type Validator::GetDeclarationType(const FuncDeclaration& decl) {
  if (decl.has_func_type) {
    return Type(decl.type_var.index());
  }
  if (decl.sig.param_types.empty()) {
    if (decl.sig.result_types.empty()) {
      return Type::Void;
    }
    if (decl.sig.result_types.size() == 1) {
      return decl.sig.result_types[0];
    }
  }
  return Type(current_module_->GetFuncTypeIndex(decl));
}